

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::anon_unknown_0::_is_scalar_next__rseq_rval(anon_unknown_0 *this,csubstr s)

{
  bool bVar1;
  int iVar2;
  ro_substr chars;
  ro_substr pattern;
  ro_substr pattern_00;
  csubstr s_local;
  
  s_local.len = (size_t)s.str;
  chars.len = 4;
  chars.str = "[{!&";
  s_local.str = (char *)this;
  bVar1 = basic_substring<const_char>::begins_with_any(&s_local,chars);
  if (((!bVar1) &&
      (pattern.len = 2, pattern.str = "? ",
      bVar1 = basic_substring<const_char>::begins_with(&s_local,pattern), !bVar1)) &&
     (pattern_00.len = 2, pattern_00.str = "- ",
     bVar1 = basic_substring<const_char>::begins_with(&s_local,pattern_00), !bVar1)) {
    iVar2 = basic_substring<const_char>::compare(&s_local,"-",1);
    return iVar2 != 0;
  }
  return false;
}

Assistant:

bool _is_scalar_next__rseq_rval(csubstr s)
{
    return !(s.begins_with_any("[{!&") || s.begins_with("? ") || s.begins_with("- ") || s == "-");
}